

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.cc
# Opt level: O2

void __thiscall cnn::ComputationGraph::PrintGraphviz(ComputationGraph *this)

{
  uint __val;
  pointer pVVar1;
  Node *pNVar2;
  ostream *poVar3;
  pointer ppNVar4;
  pointer pVVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  var_names;
  allocator local_cd;
  int local_cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  pointer local_a8;
  pointer local_a0;
  Node *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  std::operator<<((ostream *)&std::cerr,"digraph G {\n  rankdir=LR;\n  nodesep=.05;\n");
  local_a8 = (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppNVar4 = (this->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_cc = 0;
  while (ppNVar4 != local_a8) {
    local_98 = *ppNVar4;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_c8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    pVVar1 = (local_98->args).
             super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pVVar5 = (local_98->args).
                  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start; pVVar5 != pVVar1; pVVar5 = pVVar5 + 1) {
      __val = pVVar5->t;
      std::__cxx11::string::string((string *)&local_90,"v",&local_cd);
      std::__cxx11::to_string(&local_50,__val);
      std::operator+(&local_70,&local_90,&local_50);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
                 &local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
    }
    poVar3 = std::operator<<((ostream *)&std::cerr,"  N");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," [label=\"v");
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    poVar3 = std::operator<<(poVar3," = ");
    pNVar2 = local_98;
    (*local_98->_vptr_Node[3])(&local_70,local_98,&local_c8);
    local_a0 = ppNVar4;
    poVar3 = std::operator<<(poVar3,(string *)&local_70);
    std::operator<<(poVar3,"\"];\n");
    std::__cxx11::string::~string((string *)&local_70);
    pVVar1 = (pNVar2->args).
             super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pVVar5 = (pNVar2->args).
                  super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                  _M_impl.super__Vector_impl_data._M_start; pVVar5 != pVVar1; pVVar5 = pVVar5 + 1) {
      poVar3 = std::operator<<((ostream *)&std::cerr,"  N");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," -> N");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3,";\n");
    }
    local_cc = local_cc + 1;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c8);
    ppNVar4 = local_a0 + 1;
  }
  std::operator<<((ostream *)&std::cerr,"}\n");
  return;
}

Assistant:

void ComputationGraph::PrintGraphviz() const {
  cerr << "digraph G {\n  rankdir=LR;\n  nodesep=.05;\n";
  unsigned nc = 0;
  for (auto node : nodes) {
    vector<string> var_names;
    for (auto arg : node->args)
      var_names.push_back(string("v") + to_string((unsigned)arg));
    cerr << "  N" << nc << " [label=\"v" << nc << " = "
         << node->as_string(var_names) << "\"];\n";
    for (auto arg : node->args)
      cerr << "  N" << ((unsigned)arg) << " -> N" << nc << ";\n";
    ++nc;
  }
  cerr << "}\n";
}